

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitIsop.c
# Opt level: O1

uint Kit_TruthIsop5_rec(uint uOn,uint uOnDc,int nVars,Kit_Sop_t *pcRes,Vec_Int_t *vStore)

{
  Vec_Int_t *vStore_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uOnDc1;
  uint uOnDc0;
  uint uOn1;
  uint uOn0;
  Kit_Sop_t cRes2;
  Kit_Sop_t cRes1;
  Kit_Sop_t cRes0;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  Kit_Sop_t *local_70;
  Vec_Int_t *local_68;
  Kit_Sop_t local_60;
  Kit_Sop_t local_50;
  Kit_Sop_t local_40;
  
  local_78 = uOnDc;
  local_74 = uOn;
  if ((~uOnDc & uOn) != 0) {
    __assert_fail("(uOn & ~uOnDc) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                  ,0x167,
                  "unsigned int Kit_TruthIsop5_rec(unsigned int, unsigned int, int, Kit_Sop_t *, Vec_Int_t *)"
                 );
  }
  if (uOn == 0) {
    pcRes->nLits = 0;
    pcRes->nCubes = 0;
    pcRes->pCubes = (uint *)0x0;
    return 0;
  }
  if (uOnDc == 0xffffffff) {
    pcRes->nLits = 0;
    pcRes->nCubes = 1;
    iVar9 = vStore->nSize;
    vStore->nSize = iVar9 + 1;
    if (iVar9 < vStore->nCap) {
      puVar5 = (uint *)(vStore->pArray + iVar9);
    }
    else {
      puVar5 = (uint *)0x0;
    }
    pcRes->pCubes = puVar5;
    if (puVar5 == (uint *)0x0) {
      pcRes->nCubes = -1;
      return 0;
    }
    *puVar5 = 0;
    return 0xffffffff;
  }
  local_68 = vStore;
  if (nVars < 1) {
    __assert_fail("nVars > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                  ,0x17c,
                  "unsigned int Kit_TruthIsop5_rec(unsigned int, unsigned int, int, Kit_Sop_t *, Vec_Int_t *)"
                 );
  }
  iVar9 = nVars * 2;
  local_70 = pcRes;
  do {
    uVar2 = nVars;
    iVar9 = iVar9 + -2;
    if ((int)uVar2 < 1) {
      __assert_fail("Var >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                    ,0x182,
                    "unsigned int Kit_TruthIsop5_rec(unsigned int, unsigned int, int, Kit_Sop_t *, Vec_Int_t *)"
                   );
    }
    nVars = uVar2 - 1;
    iVar1 = Kit_TruthVarInSupport(&local_74,5,nVars);
  } while ((iVar1 == 0) && (iVar1 = Kit_TruthVarInSupport(&local_78,5,nVars), iVar1 == 0));
  local_80 = local_74;
  local_7c = local_74;
  local_88 = local_78;
  local_84 = local_78;
  Kit_TruthCofactor0(&local_7c,uVar2,nVars);
  Kit_TruthCofactor1(&local_80,uVar2,nVars);
  Kit_TruthCofactor0(&local_84,uVar2,nVars);
  Kit_TruthCofactor1(&local_88,uVar2,nVars);
  vStore_00 = local_68;
  uVar2 = Kit_TruthIsop5_rec(~local_88 & local_7c,local_84,nVars,&local_40,local_68);
  if ((ulong)(uint)local_40.nCubes == 0xffffffff) {
LAB_005d759e:
    local_70->nCubes = -1;
    return 0;
  }
  uVar3 = Kit_TruthIsop5_rec(~local_84 & local_80,local_88,nVars,&local_50,vStore_00);
  if ((ulong)(uint)local_50.nCubes == 0xffffffff) goto LAB_005d759e;
  uVar4 = Kit_TruthIsop5_rec(~uVar3 & local_80 | ~uVar2 & local_7c,local_88 & local_84,nVars,
                             &local_60,vStore_00);
  if ((ulong)(uint)local_60.nCubes == 0xffffffff) goto LAB_005d759e;
  local_70->nLits =
       local_40.nLits + local_40.nCubes + local_50.nCubes + local_50.nLits + local_60.nLits;
  uVar6 = local_60.nCubes + local_40.nCubes + local_50.nCubes;
  local_70->nCubes = uVar6;
  if (uVar6 != 0) {
    if ((int)uVar6 < 1) {
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x3a5,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
    }
    lVar8 = (long)(int)uVar6 + (long)local_68->nSize;
    iVar1 = (int)lVar8;
    local_68->nSize = iVar1;
    if (iVar1 <= local_68->nCap) {
      puVar5 = (uint *)(local_68->pArray + (lVar8 - (ulong)uVar6));
      goto LAB_005d760f;
    }
  }
  puVar5 = (uint *)0x0;
LAB_005d760f:
  local_70->pCubes = puVar5;
  if (puVar5 == (uint *)0x0) {
    local_70->nCubes = -1;
    return 0;
  }
  if (local_40.nCubes < 1) {
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    do {
      puVar5[uVar10] = local_40.pCubes[uVar10] | 1 << ((byte)iVar9 & 0x1f);
      uVar10 = uVar10 + 1;
    } while ((uint)local_40.nCubes != uVar10);
  }
  if (0 < local_50.nCubes) {
    uVar7 = 0;
    do {
      puVar5[(uVar10 & 0xffffffff) + uVar7] = local_50.pCubes[uVar7] | 2 << ((byte)iVar9 & 0x1f);
      uVar7 = uVar7 + 1;
    } while ((uint)local_50.nCubes != uVar7);
    uVar10 = (ulong)(uint)((int)uVar10 + (int)uVar7);
  }
  iVar9 = (int)uVar10;
  if (0 < local_60.nCubes) {
    uVar7 = 0;
    do {
      puVar5[(uVar10 & 0xffffffff) + uVar7] = local_60.pCubes[uVar7];
      uVar7 = uVar7 + 1;
    } while ((uint)local_60.nCubes != uVar7);
    iVar9 = iVar9 + (int)uVar7;
  }
  if (iVar9 != local_70->nCubes) {
    __assert_fail("k == pcRes->nCubes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                  ,0x1ad,
                  "unsigned int Kit_TruthIsop5_rec(unsigned int, unsigned int, int, Kit_Sop_t *, Vec_Int_t *)"
                 );
  }
  return uVar3 & *(uint *)(&DAT_00a07310 + (ulong)(uint)nVars * 4) | uVar4 |
         uVar2 & ~*(uint *)(&DAT_00a07310 + (ulong)(uint)nVars * 4);
}

Assistant:

unsigned Kit_TruthIsop5_rec( unsigned uOn, unsigned uOnDc, int nVars, Kit_Sop_t * pcRes, Vec_Int_t * vStore )
{
    unsigned uMasks[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    Kit_Sop_t cRes0, cRes1, cRes2;
    Kit_Sop_t * pcRes0 = &cRes0, * pcRes1 = &cRes1, * pcRes2 = &cRes2;
    unsigned uOn0, uOn1, uOnDc0, uOnDc1, uRes0, uRes1, uRes2;
    int i, k, Var;
    assert( nVars <= 5 );
    assert( (uOn & ~uOnDc) == 0 );
    if ( uOn == 0 )
    {
        pcRes->nLits  = 0;
        pcRes->nCubes = 0;
        pcRes->pCubes = NULL;
        return 0;
    }
    if ( uOnDc == 0xFFFFFFFF )
    {
        pcRes->nLits  = 0;
        pcRes->nCubes = 1;
        pcRes->pCubes = Vec_IntFetch( vStore, 1 );
        if ( pcRes->pCubes == NULL )
        {
            pcRes->nCubes = -1;
            return 0;
        }
        pcRes->pCubes[0] = 0;
        return 0xFFFFFFFF;
    }
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Kit_TruthVarInSupport( &uOn, 5, Var ) || 
             Kit_TruthVarInSupport( &uOnDc, 5, Var ) )
             break;
    assert( Var >= 0 );
    // cofactor
    uOn0   = uOn1   = uOn;
    uOnDc0 = uOnDc1 = uOnDc;
    Kit_TruthCofactor0( &uOn0, Var + 1, Var );
    Kit_TruthCofactor1( &uOn1, Var + 1, Var );
    Kit_TruthCofactor0( &uOnDc0, Var + 1, Var );
    Kit_TruthCofactor1( &uOnDc1, Var + 1, Var );
    // solve for cofactors
    uRes0 = Kit_TruthIsop5_rec( uOn0 & ~uOnDc1, uOnDc0, Var, pcRes0, vStore );
    if ( pcRes0->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return 0;
    }
    uRes1 = Kit_TruthIsop5_rec( uOn1 & ~uOnDc0, uOnDc1, Var, pcRes1, vStore );
    if ( pcRes1->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return 0;
    }
    uRes2 = Kit_TruthIsop5_rec( (uOn0 & ~uRes0) | (uOn1 & ~uRes1), uOnDc0 & uOnDc1, Var, pcRes2, vStore );
    if ( pcRes2->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return 0;
    }
    // create the resulting cover
    pcRes->nLits  = pcRes0->nLits  + pcRes1->nLits  + pcRes2->nLits + pcRes0->nCubes + pcRes1->nCubes;
    pcRes->nCubes = pcRes0->nCubes + pcRes1->nCubes + pcRes2->nCubes;
    pcRes->pCubes = Vec_IntFetch( vStore, pcRes->nCubes );
    if ( pcRes->pCubes == NULL )
    {
        pcRes->nCubes = -1;
        return 0;
    }
    k = 0;
    for ( i = 0; i < pcRes0->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes0->pCubes[i] | (1 << ((Var<<1)+0));
    for ( i = 0; i < pcRes1->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes1->pCubes[i] | (1 << ((Var<<1)+1));
    for ( i = 0; i < pcRes2->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes2->pCubes[i];
    assert( k == pcRes->nCubes );
    // derive the final truth table
    uRes2 |= (uRes0 & ~uMasks[Var]) | (uRes1 & uMasks[Var]);
//    assert( (uOn & ~uRes2) == 0 );
//    assert( (uRes2 & ~uOnDc) == 0 );
    return uRes2;
}